

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  bool bVar1;
  undefined1 uVar2;
  SQFunctionProto *func_00;
  long in_RDI;
  SQObjectPtr func;
  SQObjectPtr *in_stack_000000c8;
  SQREADFUNC in_stack_000000d0;
  SQUserPointer in_stack_000000d8;
  SQVM *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff78;
  SQObjectType in_stack_ffffffffffffff7c;
  SQClosure *in_stack_ffffffffffffff80;
  HSQUIRRELVM in_stack_ffffffffffffff88;
  SQClosure *x;
  undefined7 in_stack_ffffffffffffffa0;
  SQObjectPtr local_38 [2];
  long local_10;
  byte local_1;
  
  local_10 = in_RDI;
  bVar1 = CheckTag(in_stack_ffffffffffffff88,(SQREADFUNC)in_stack_ffffffffffffff80,
                   (SQUserPointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  if (bVar1) {
    bVar1 = CheckTag(in_stack_ffffffffffffff88,(SQREADFUNC)in_stack_ffffffffffffff80,
                     (SQUserPointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0)
    ;
    if (bVar1) {
      bVar1 = CheckTag(in_stack_ffffffffffffff88,(SQREADFUNC)in_stack_ffffffffffffff80,
                       (SQUserPointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       0);
      if (bVar1) {
        bVar1 = CheckTag(in_stack_ffffffffffffff88,(SQREADFUNC)in_stack_ffffffffffffff80,
                         (SQUserPointer)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        if (bVar1) {
          ::SQObjectPtr::SQObjectPtr(local_38);
          bVar1 = SQFunctionProto::Load
                            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8
                            );
          if (bVar1) {
            uVar2 = CheckTag(in_stack_ffffffffffffff88,(SQREADFUNC)in_stack_ffffffffffffff80,
                             (SQUserPointer)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
            if ((bool)uVar2) {
              x = *(SQClosure **)(local_10 + 0x118);
              func_00 = (SQFunctionProto *)
                        SQRefCounted::GetWeakRef
                                  ((SQRefCounted *)in_stack_ffffffffffffff80,
                                   in_stack_ffffffffffffff7c);
              in_stack_ffffffffffffff80 =
                   Create((SQSharedState *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),func_00,
                          local_38[0].super_SQObject._unVal.pWeakRef);
              ::SQObjectPtr::operator=((SQObjectPtr *)local_38[0].super_SQObject._unVal.pTable,x);
              local_1 = 1;
            }
            else {
              local_1 = 0;
            }
          }
          else {
            local_1 = 0;
          }
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQChar)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQInteger)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQFloat)));
    SQObjectPtr func;
    _CHECK_IO(SQFunctionProto::Load(v,up,read,func));
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_TAIL));
    ret = SQClosure::Create(_ss(v),_funcproto(func),_table(v->_roottable)->GetWeakRef(OT_TABLE));
    //FIXME: load an root for this closure
    return true;
}